

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

Bounds2f __thiscall pbrt::FilmBase::SampleBounds(FilmBase *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  float fVar5;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  Bounds2f BVar12;
  undefined1 auVar6 [16];
  
  uVar1 = *(undefined8 *)
           ((this->filter).
            super_TaggedPointer<pbrt::BoxFilter,_pbrt::GaussianFilter,_pbrt::MitchellFilter,_pbrt::LanczosSincFilter,_pbrt::TriangleFilter>
            .bits & 0xffffffffffff);
  auVar8._8_8_ = uVar1;
  auVar8._0_8_ = uVar1;
  auVar3 = vcvtdq2ps_avx((undefined1  [16])this->pixelBounds);
  auVar11._0_4_ = (float)uVar1 + auVar3._0_4_;
  fVar10 = (float)((ulong)uVar1 >> 0x20);
  auVar11._4_4_ = fVar10 + auVar3._4_4_;
  auVar11._8_4_ = (float)uVar1 + auVar3._8_4_;
  auVar11._12_4_ = fVar10 + auVar3._12_4_;
  auVar3 = vsubps_avx(auVar3,auVar8);
  auVar3 = vshufpd_avx(auVar11,auVar3,1);
  auVar9._0_4_ = auVar3._0_4_ + -0.5;
  auVar9._4_4_ = auVar3._4_4_ + -0.5;
  auVar9._8_4_ = auVar3._8_4_ + 0.5;
  auVar9._12_4_ = auVar3._12_4_ + 0.5;
  auVar3 = vshufpd_avx(auVar9,auVar9,1);
  uVar4 = vcmpps_avx512vl(auVar9,auVar3,1);
  auVar3 = vshufpd_avx(auVar9,auVar9,3);
  bVar2 = (bool)((byte)uVar4 & 1);
  fVar5 = (float)((uint)bVar2 * (int)auVar9._0_4_ | (uint)!bVar2 * auVar3._0_4_);
  bVar2 = (bool)((byte)(uVar4 >> 1) & 1);
  fVar7 = (float)((uint)bVar2 * (int)auVar9._4_4_ | (uint)!bVar2 * auVar3._4_4_);
  BVar12.pMin.super_Tuple2<pbrt::Point2,_float>.y = fVar7;
  BVar12.pMin.super_Tuple2<pbrt::Point2,_float>.x = fVar5;
  bVar2 = (bool)((byte)(uVar4 >> 2) & 1);
  auVar6._8_4_ = (uint)bVar2 * (int)auVar9._0_4_ | (uint)!bVar2 * auVar3._8_4_;
  auVar6._0_4_ = fVar5;
  auVar6._4_4_ = fVar7;
  bVar2 = (bool)((byte)(uVar4 >> 3) & 1);
  auVar6._12_4_ = (uint)bVar2 * (int)auVar9._4_4_ | (uint)!bVar2 * auVar3._12_4_;
  auVar3 = vshufpd_avx(auVar6,auVar6,1);
  BVar12.pMax.super_Tuple2<pbrt::Point2,_float> = auVar3._0_8_;
  return BVar12;
}

Assistant:

PBRT_CPU_GPU inline auto operator()(F func, Tp tp, int tag, TypePack<Ts...> types) {
        constexpr int mid = n / 2;

        if (tag - 1 < mid)  // 0-based indexing here to be more traditional
            return DispatchSplit<mid>()(
                func, tp, tag, typename TakeFirstN<mid, TypePack<Ts...>>::type());
        else
            return DispatchSplit<n - mid>()(
                func, tp, tag - mid, typename RemoveFirstN<mid, TypePack<Ts...>>::type());
    }